

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O2

string * __thiscall
RenX_Ladder_WebPlugin::generate_profile_page_abi_cxx11_
          (RenX_Ladder_WebPlugin *this,LadderDatabase *db,uint8_t format,uint64_t steam_id,
          query_table_type *query_params)

{
  undefined8 uVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long lVar3;
  Entry *pEVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  string profile_data;
  string local_50;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (this_00->_M_dataplus)._M_p = (pointer)&this_00->field_2;
  this_00->_M_string_length = 0;
  (this_00->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (this_00,0x800);
  if ((this->FLAG_INCLUDE_PAGE_HEADER & format) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this_00,&this->header);
  }
  if ((this->FLAG_INCLUDE_SEARCH & format) != 0) {
    generate_search_abi_cxx11_(&profile_data,db);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this_00,&profile_data);
    std::__cxx11::string::~string((string *)&profile_data);
  }
  if ((this->FLAG_INCLUDE_SELECTOR & format) != 0) {
    generate_database_selector_abi_cxx11_(&profile_data,db,query_params);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this_00,&profile_data);
    std::__cxx11::string::~string((string *)&profile_data);
  }
  lVar3 = RenX::LadderDatabase::getEntries();
  if (lVar3 == 0) {
    profile_data._M_dataplus._M_p = (pointer)0x15;
    pcVar5 = "Error: No ladder data";
  }
  else {
    for (pEVar4 = (Entry *)RenX::LadderDatabase::getHead(); pEVar4 != (Entry *)0x0;
        pEVar4 = pEVar4->next) {
      if (pEVar4->steam_id == steam_id) {
        std::__cxx11::string::string((string *)&profile_data,&this->entry_profile);
        RenX::processTags((string *)&profile_data,pEVar4);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (this_00,&profile_data);
        local_50._M_dataplus._M_p = (pointer)0x20;
        local_50._M_string_length = 0x1127bf;
        std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)this_00,(basic_string_view<char,_std::char_traits<char>_> *)&local_50);
        if (pEVar4->prev != (Entry *)0x0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&profile_data,&this->entry_profile_previous);
          uVar1 = *(undefined8 *)(RenX::tags + 0x14e8);
          uVar2 = *(undefined8 *)(RenX::tags + 0x14f0);
          auVar6 = RenX::LadderDatabase::getName();
          RenX::replace_tag(&profile_data,uVar2,uVar1,auVar6._0_8_,auVar6._8_8_);
          uVar1 = *(undefined8 *)(RenX::tags + 0x14c8);
          uVar2 = *(undefined8 *)(RenX::tags + 0x14d0);
          string_printf_abi_cxx11_(&local_50,"%llu",pEVar4->prev->steam_id);
          RenX::replace_tag(&profile_data,uVar2,uVar1,local_50._M_string_length,
                            local_50._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_50);
          RenX::processTags((string *)&profile_data,pEVar4->prev);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (this_00,&profile_data);
        }
        if (pEVar4->next != (Entry *)0x0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&profile_data,&this->entry_profile_next);
          uVar1 = *(undefined8 *)(RenX::tags + 0x14e8);
          uVar2 = *(undefined8 *)(RenX::tags + 0x14f0);
          auVar6 = RenX::LadderDatabase::getName();
          RenX::replace_tag(&profile_data,uVar2,uVar1,auVar6._0_8_,auVar6._8_8_);
          uVar1 = *(undefined8 *)(RenX::tags + 0x908);
          uVar2 = *(undefined8 *)(RenX::tags + 0x910);
          string_printf_abi_cxx11_(&local_50,"%llu",pEVar4->next->steam_id);
          RenX::replace_tag(&profile_data,uVar2,uVar1,local_50._M_string_length,
                            local_50._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_50);
          RenX::processTags((string *)&profile_data,pEVar4->next);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (this_00,&profile_data);
        }
        local_50._M_dataplus._M_p = (pointer)0x6;
        local_50._M_string_length = 0x112775;
        std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                  ((string *)this_00,(basic_string_view<char,_std::char_traits<char>_> *)&local_50);
        std::__cxx11::string::~string((string *)&profile_data);
        goto LAB_0010f909;
      }
    }
    profile_data._M_dataplus._M_p = (pointer)0x17;
    pcVar5 = "Error: Player not found";
  }
  profile_data._M_string_length = (size_type)pcVar5;
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)this_00,(basic_string_view<char,_std::char_traits<char>_> *)&profile_data);
LAB_0010f909:
  if ((this->FLAG_INCLUDE_PAGE_FOOTER & format) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (this_00,&this->footer);
  }
  return this_00;
}

Assistant:

std::string* RenX_Ladder_WebPlugin::generate_profile_page(RenX::LadderDatabase *db, uint8_t format, uint64_t steam_id, const query_table_type& query_params) {
	std::string* result = new std::string();
	result->reserve(2048);

	if ((format & this->FLAG_INCLUDE_PAGE_HEADER) != 0)
		result->append(RenX_Ladder_WebPlugin::header);

	if ((format & this->FLAG_INCLUDE_SEARCH) != 0) // Search
		result->append(generate_search(db));

	if ((format & this->FLAG_INCLUDE_SELECTOR) != 0) // Selector
		result->append(generate_database_selector(db, query_params));

	if (db->getEntries() == 0) { // No ladder data
		result->append("Error: No ladder data"sv);

		if ((format & this->FLAG_INCLUDE_PAGE_FOOTER) != 0) // Footer
			result->append(RenX_Ladder_WebPlugin::footer);

		return result;
	}

	RenX::LadderDatabase::Entry *entry = db->getHead();
	while (entry != nullptr) {
		if (entry->steam_id == steam_id) // match found
			break;
		entry = entry->next;
	}

	if (entry == nullptr) {
		result->append("Error: Player not found"sv);
	}
	else {
		std::string profile_data(RenX_Ladder_WebPlugin::entry_profile);
		RenX::processTags(profile_data, *entry);
		result->append(profile_data);

		result->append("<div class=\"profile-navigation\">"sv);
		if (entry->prev != nullptr)
		{
			profile_data = RenX_Ladder_WebPlugin::entry_profile_previous;
			RenX::replace_tag(profile_data, RenX::tags->INTERNAL_OBJECT_TAG, db->getName());
			RenX::replace_tag(profile_data, RenX::tags->INTERNAL_WEAPON_TAG, string_printf("%llu", entry->prev->steam_id));
			RenX::processTags(profile_data, *entry->prev);
			result->append(profile_data);
		}
		if (entry->next != nullptr)
		{
			profile_data = RenX_Ladder_WebPlugin::entry_profile_next;
			RenX::replace_tag(profile_data, RenX::tags->INTERNAL_OBJECT_TAG, db->getName());
			RenX::replace_tag(profile_data, RenX::tags->INTERNAL_VICTIM_STEAM_TAG, string_printf("%llu", entry->next->steam_id));
			RenX::processTags(profile_data, *entry->next);
			result->append(profile_data);
		}
		result->append("</div>"sv);
	}

	if ((format & this->FLAG_INCLUDE_PAGE_FOOTER) != 0) // Footer
		result->append(RenX_Ladder_WebPlugin::footer);

	return result;
}